

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall
xatlas::internal::
HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
::add(HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
      *this,Vector2 *key)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t hash;
  Vector2 *key_local;
  HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
  *this_local;
  
  if (this->m_slots == (uint32_t *)0x0) {
    alloc(this);
  }
  uVar1 = computeHash(this,key);
  Array<xatlas::internal::Vector2>::push_back(&this->m_keys,key);
  Array<unsigned_int>::push_back(&this->m_next,this->m_slots + uVar1);
  uVar2 = Array<unsigned_int>::size(&this->m_next);
  this->m_slots[uVar1] = uVar2 - 1;
  return;
}

Assistant:

void add(const Key &key)
	{
		if (!m_slots)
			alloc();
		const uint32_t hash = computeHash(key);
		m_keys.push_back(key);
		m_next.push_back(m_slots[hash]);
		m_slots[hash] = m_next.size() - 1;
	}